

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::Texture2DFormatCase::iterate(Texture2DFormatCase *this)

{
  ostringstream *this_00;
  int preferredHeight;
  RenderContext *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  RGBA threshold;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *description;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  Surface renderedFrame;
  TextureFormatInfo spec;
  RandomViewport local_310;
  TextureFormat local_300;
  _Vector_base<float,_std::allocator<float>_> local_2f8;
  Surface local_2e0;
  Surface local_2c8;
  Texture2DView local_2b0;
  TextureParameterValueStr local_2a0;
  TextureParameterValueStr local_298;
  TextureParameterValueStr local_290;
  ReferenceParams local_284;
  TextureFormatInfo local_1f0;
  undefined1 local_1b0 [384];
  long lVar5;
  
  local_300 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = this->m_width;
  preferredHeight = this->m_height;
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_310,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),iVar2,preferredHeight,dVar4)
  ;
  tcu::Surface::Surface(&local_2c8,local_310.width,local_310.height);
  tcu::Surface::Surface(&local_2e0,local_310.width,local_310.height);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_1b0._0_4_ =
       tcu::PixelFormat::getColorThreshold((PixelFormat *)(CONCAT44(extraout_var_01,iVar2) + 8));
  local_284.super_RenderParams.texType = 0x1010101;
  threshold = tcu::operator+((RGBA *)local_1b0,(RGBA *)&local_284);
  local_2f8._M_impl.super__Vector_impl_data._M_start = (float *)0x0;
  local_2f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_284,TEXTURETYPE_2D);
  tcu::getTextureFormatInfo(&local_1f0,(TextureFormat *)&this->m_texture->m_refTexture);
  local_284.super_RenderParams.flags._0_1_ = (byte)local_284.super_RenderParams.flags | 0xc;
  local_284.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  local_284.sampler.magFilter = NEAREST;
  local_284.sampler.lodThreshold = 0.0;
  local_284.sampler.wrapS = CLAMP_TO_EDGE;
  local_284.sampler.wrapT = CLAMP_TO_EDGE;
  local_284.sampler.wrapR = CLAMP_TO_EDGE;
  local_284.sampler.minFilter = NEAREST;
  local_284.sampler.normalizedCoords = true;
  local_284.sampler.compare = COMPAREMODE_NONE;
  local_284.sampler.compareChannel = 0;
  local_284.sampler.borderColor.v._0_8_ = 0;
  local_284.sampler.borderColor.v._8_8_ = 0;
  local_284.sampler.seamlessCubeMap = false;
  local_284.sampler._53_3_ = 0;
  local_284.sampler.depthStencilMode = MODE_DEPTH;
  local_284.super_RenderParams.colorScale.m_data[0] = local_1f0.lookupScale.m_data[0];
  local_284.super_RenderParams.colorScale.m_data[1] = local_1f0.lookupScale.m_data[1];
  local_284.super_RenderParams.colorScale.m_data[2] = local_1f0.lookupScale.m_data[2];
  local_284.super_RenderParams.colorScale.m_data[3] = local_1f0.lookupScale.m_data[3];
  local_1b0._0_4_ = R;
  local_1b0._4_4_ = SNORM_INT8;
  local_284.super_RenderParams.colorBias.m_data[0] = local_1f0.lookupBias.m_data[0];
  local_284.super_RenderParams.colorBias.m_data[1] = local_1f0.lookupBias.m_data[1];
  local_284.super_RenderParams.colorBias.m_data[2] = local_1f0.lookupBias.m_data[2];
  local_284.super_RenderParams.colorBias.m_data[3] = local_1f0.lookupBias.m_data[3];
  local_2b0.m_numLevels = 0x3f800000;
  local_2b0._4_4_ = 0x3f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D
            ((vector<float,_std::allocator<float>_> *)&local_2f8,(Vec2 *)local_1b0,
             (Vec2 *)&local_2b0);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_4_ = local_300.order;
  local_1b0._4_4_ = local_300.type;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Texture parameters:");
  std::operator<<((ostream *)this_00,"\n  WRAP_S = ");
  local_2b0.m_numLevels = 0x2802;
  local_2b0._4_4_ = 0x812f;
  glu::detail::operator<<((ostream *)this_00,(TextureParameterValueStr *)&local_2b0);
  std::operator<<((ostream *)this_00,"\n  WRAP_T = ");
  local_290.param = 0x2803;
  local_290.value = 0x812f;
  glu::detail::operator<<((ostream *)this_00,&local_290);
  std::operator<<((ostream *)this_00,"\n  MIN_FILTER = ");
  local_298.param = 0x2801;
  local_298.value = 0x2600;
  glu::detail::operator<<((ostream *)this_00,&local_298);
  std::operator<<((ostream *)this_00,"\n  MAG_FILTER = ");
  local_2a0.param = 0x2800;
  local_2a0.value = 0x2600;
  glu::detail::operator<<((ostream *)this_00,&local_2a0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  (**(code **)(lVar5 + 0x1a00))(local_310.x,local_310.y,local_310.width,local_310.height);
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar5 + 8))(0x84c0);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFormatTests.cpp"
                  ,0xc9);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,local_2f8._M_impl.super__Vector_impl_data._M_start,
             &local_284.super_RenderParams);
  context = this->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&local_2c8);
  glu::readPixels(context,local_310.x,local_310.y,(PixelBufferAccess *)local_1b0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFormatTests.cpp"
                  ,0xce);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)local_1b0,&local_2e0,
             (PixelFormat *)(CONCAT44(extraout_var_02,iVar2) + 8));
  local_2b0.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
  local_2b0.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)local_1b0,&local_2b0,
             local_2f8._M_impl.super__Vector_impl_data._M_start,&local_284);
  bVar1 = glu::TextureTestUtil::compareImages((TestLog *)local_300,&local_2e0,&local_2c8,threshold);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar1,description);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_2f8);
  tcu::Surface::~Surface(&local_2e0);
  tcu::Surface::~Surface(&local_2c8);
  return STOP;
}

Assistant:

Texture2DFormatCase::IterateResult Texture2DFormatCase::iterate (void)
{
	TestLog&				log					= m_testCtx.getLog();
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_width, m_height, deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams		(TEXTURETYPE_2D);
	tcu::TextureFormatInfo	spec				= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());
	const deUint32			wrapS				= GL_CLAMP_TO_EDGE;
	const deUint32			wrapT				= GL_CLAMP_TO_EDGE;
	const deUint32			minFilter			= GL_NEAREST;
	const deUint32			magFilter			= GL_NEAREST;

	renderParams.flags			|= RenderParams::LOG_ALL;
	renderParams.samplerType	= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	log << TestLog::Message << "Texture parameters:"
							<< "\n  WRAP_S = " << glu::getTextureParameterValueStr(GL_TEXTURE_WRAP_S, wrapS)
							<< "\n  WRAP_T = " << glu::getTextureParameterValueStr(GL_TEXTURE_WRAP_T, wrapT)
							<< "\n  MIN_FILTER = " << glu::getTextureParameterValueStr(GL_TEXTURE_MIN_FILTER, minFilter)
							<< "\n  MAG_FILTER = " << glu::getTextureParameterValueStr(GL_TEXTURE_MAG_FILTER, magFilter)
		<< TestLog::EndMessage;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Upload texture data to GL.
	m_texture->upload();

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}